

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void pty_init(void)

{
  undefined4 local_18;
  undefined1 local_14 [4];
  int slave;
  int master;
  winsize ws;
  
  memset(&slave,0,8);
  slave._2_2_ = 0x50;
  slave._0_2_ = 0x18;
  openpty(local_14,&local_18,0,0,&slave);
  login_tty(local_18);
  return;
}

Assistant:

static void
pty_init(void)
{
	struct winsize	 ws;
	int		 master;
	int		 slave;

	memset(&ws, 0, sizeof(ws));
	ws.ws_col = 80,
	ws.ws_row = 24;

	openpty(&master, &slave, NULL, NULL, &ws);
	login_tty(slave);

	return;
}